

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(ASDCP_MCAConfigParser *this,Dictionary *d)

{
  byte_t *pbVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_bool>
  pVar2;
  UL local_18d8;
  allocator<char> local_18b1;
  string local_18b0;
  label_traits local_1890;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1848;
  _Base_ptr local_17e0;
  undefined1 local_17d8;
  UL local_17d0;
  allocator<char> local_17a9;
  string local_17a8;
  label_traits local_1788;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1740;
  _Base_ptr local_16d8;
  undefined1 local_16d0;
  UL local_16c8;
  allocator<char> local_16a1;
  string local_16a0;
  label_traits local_1680;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1638;
  _Base_ptr local_15d0;
  undefined1 local_15c8;
  UL local_15c0;
  allocator<char> local_1599;
  string local_1598;
  label_traits local_1578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1530;
  _Base_ptr local_14c8;
  undefined1 local_14c0;
  UL local_14b8;
  allocator<char> local_1491;
  string local_1490;
  label_traits local_1470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1428;
  _Base_ptr local_13c0;
  undefined1 local_13b8;
  UL local_13b0;
  allocator<char> local_1389;
  string local_1388;
  label_traits local_1368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1320;
  _Base_ptr local_12b8;
  undefined1 local_12b0;
  UL local_12a8;
  allocator<char> local_1281;
  string local_1280;
  label_traits local_1260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1218;
  _Base_ptr local_11b0;
  undefined1 local_11a8;
  UL local_11a0;
  allocator<char> local_1179;
  string local_1178;
  label_traits local_1158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1110;
  _Base_ptr local_10a8;
  undefined1 local_10a0;
  UL local_1098;
  allocator<char> local_1071;
  string local_1070;
  label_traits local_1050;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1008;
  _Base_ptr local_fa0;
  undefined1 local_f98;
  UL local_f90;
  allocator<char> local_f69;
  string local_f68;
  label_traits local_f48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_f00;
  _Base_ptr local_e98;
  undefined1 local_e90;
  UL local_e88;
  allocator<char> local_e61;
  string local_e60;
  label_traits local_e40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_df8;
  _Base_ptr local_d90;
  undefined1 local_d88;
  UL local_d80;
  allocator<char> local_d59;
  string local_d58;
  label_traits local_d38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_cf0;
  _Base_ptr local_c88;
  undefined1 local_c80;
  UL local_c78;
  allocator<char> local_c51;
  string local_c50;
  label_traits local_c30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_be8;
  _Base_ptr local_b80;
  undefined1 local_b78;
  UL local_b70;
  allocator<char> local_b49;
  string local_b48;
  label_traits local_b28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_ae0;
  _Base_ptr local_a78;
  undefined1 local_a70;
  UL local_a68;
  allocator<char> local_a41;
  string local_a40;
  label_traits local_a20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_9d8;
  _Base_ptr local_970;
  undefined1 local_968;
  UL local_960;
  allocator<char> local_939;
  string local_938;
  label_traits local_918;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_8d0;
  _Base_ptr local_868;
  undefined1 local_860;
  UL local_858;
  allocator<char> local_831;
  string local_830;
  label_traits local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_7c8;
  _Base_ptr local_760;
  undefined1 local_758;
  UL local_750;
  allocator<char> local_729;
  string local_728;
  label_traits local_708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_6c0;
  _Base_ptr local_658;
  undefined1 local_650;
  UL local_648;
  allocator<char> local_621;
  string local_620;
  label_traits local_600;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_5b8;
  _Base_ptr local_550;
  undefined1 local_548;
  UL local_540;
  allocator<char> local_519;
  string local_518;
  label_traits local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_4b0;
  _Base_ptr local_448;
  undefined1 local_440;
  UL local_438;
  allocator<char> local_411;
  string local_410;
  label_traits local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_3a8;
  _Base_ptr local_340;
  undefined1 local_338;
  UL local_330;
  allocator<char> local_309;
  string local_308;
  label_traits local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_2a0;
  _Base_ptr local_238;
  undefined1 local_230;
  UL local_228;
  allocator<char> local_201;
  string local_200;
  label_traits local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_198;
  _Base_ptr local_130;
  undefined1 local_128;
  UL local_120;
  allocator<char> local_e9;
  string local_e8;
  label_traits local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_80;
  Dictionary *local_18;
  Dictionary *d_local;
  ASDCP_MCAConfigParser *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            (&this->super_InterchangeObject_list_t);
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
  ::map(&this->m_LabelMap);
  this->m_ChannelCount = 0;
  this->m_Dict = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Left",&local_e9);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_L);
  UL::UL(&local_120,pbVar1);
  label_traits::label_traits(&local_c8,&local_e8,true,&local_120);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_80,(char (*) [2])0x2d1caf,&local_c8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_80);
  local_130 = (_Base_ptr)pVar2.first._M_node;
  local_128 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_80);
  label_traits::~label_traits(&local_c8);
  UL::~UL(&local_120);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"Right",&local_201);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_R);
  UL::UL(&local_228,pbVar1);
  label_traits::label_traits(&local_1e0,&local_200,true,&local_228);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_198,(char (*) [2])0x2d28e8,&local_1e0);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_198);
  local_238 = (_Base_ptr)pVar2.first._M_node;
  local_230 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_198);
  label_traits::~label_traits(&local_1e0);
  UL::~UL(&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Center",&local_309);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_C);
  UL::UL(&local_330,pbVar1);
  label_traits::label_traits(&local_2e8,&local_308,true,&local_330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_2a0,(char (*) [2])0x2d0fdf,&local_2e8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_2a0);
  local_340 = (_Base_ptr)pVar2.first._M_node;
  local_338 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_2a0);
  label_traits::~label_traits(&local_2e8);
  UL::~UL(&local_330);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"LFE",&local_411);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_LFE);
  UL::UL(&local_438,pbVar1);
  label_traits::label_traits(&local_3f0,&local_410,true,&local_438);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_3a8,(char (*) [4])0x2d05ac,&local_3f0);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_3a8);
  local_448 = (_Base_ptr)pVar2.first._M_node;
  local_440 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_3a8);
  label_traits::~label_traits(&local_3f0);
  UL::~UL(&local_438);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"Left Surround",&local_519);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Ls);
  UL::UL(&local_540,pbVar1);
  label_traits::label_traits(&local_4f8,&local_518,true,&local_540);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_4b0,(char (*) [3])0x2d05bf,&local_4f8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_4b0);
  local_550 = (_Base_ptr)pVar2.first._M_node;
  local_548 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_4b0);
  label_traits::~label_traits(&local_4f8);
  UL::~UL(&local_540);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"Right Surround",&local_621);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Rs);
  UL::UL(&local_648,pbVar1);
  label_traits::label_traits(&local_600,&local_620,true,&local_648);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_5b8,(char (*) [3])0x2d05d1,&local_600);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_5b8);
  local_658 = (_Base_ptr)pVar2.first._M_node;
  local_650 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_5b8);
  label_traits::~label_traits(&local_600);
  UL::~UL(&local_648);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Left Side Surround",&local_729);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Lss);
  UL::UL(&local_750,pbVar1);
  label_traits::label_traits(&local_708,&local_728,true,&local_750);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_6c0,(char (*) [4])0x2d05e3,&local_708);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_6c0);
  local_760 = (_Base_ptr)pVar2.first._M_node;
  local_758 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_6c0);
  label_traits::~label_traits(&local_708);
  UL::~UL(&local_750);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"Right Side Surround",&local_831);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Rss);
  UL::UL(&local_858,pbVar1);
  label_traits::label_traits(&local_810,&local_830,true,&local_858);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_7c8,(char (*) [4])0x2d05f6,&local_810);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_7c8);
  local_868 = (_Base_ptr)pVar2.first._M_node;
  local_860 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_7c8);
  label_traits::~label_traits(&local_810);
  UL::~UL(&local_858);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"Left Rear Surround",&local_939);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Lrs);
  UL::UL(&local_960,pbVar1);
  label_traits::label_traits(&local_918,&local_938,true,&local_960);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_8d0,(char (*) [4])0x2d0609,&local_918);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_8d0);
  local_970 = (_Base_ptr)pVar2.first._M_node;
  local_968 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_8d0);
  label_traits::~label_traits(&local_918);
  UL::~UL(&local_960);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"Right Rear Surround",&local_a41);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Rrs);
  UL::UL(&local_a68,pbVar1);
  label_traits::label_traits(&local_a20,&local_a40,true,&local_a68);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_9d8,(char (*) [4])0x2d061c,&local_a20);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_9d8);
  local_a78 = (_Base_ptr)pVar2.first._M_node;
  local_a70 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_9d8);
  label_traits::~label_traits(&local_a20);
  UL::~UL(&local_a68);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"Left Center",&local_b49);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Lc);
  UL::UL(&local_b70,pbVar1);
  label_traits::label_traits(&local_b28,&local_b48,true,&local_b70);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_ae0,(char (*) [3])0x2d062f,&local_b28);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_ae0);
  local_b80 = (_Base_ptr)pVar2.first._M_node;
  local_b78 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_ae0);
  label_traits::~label_traits(&local_b28);
  UL::~UL(&local_b70);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"Right Center",&local_c51)
  ;
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Rc);
  UL::UL(&local_c78,pbVar1);
  label_traits::label_traits(&local_c30,&local_c50,true,&local_c78);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_be8,(char (*) [3])0x2d0641,&local_c30);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_be8);
  local_c88 = (_Base_ptr)pVar2.first._M_node;
  local_c80 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_be8);
  label_traits::~label_traits(&local_c30);
  UL::~UL(&local_c78);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d58,"Center Surround",&local_d59);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_Cs);
  UL::UL(&local_d80,pbVar1);
  label_traits::label_traits(&local_d38,&local_d58,true,&local_d80);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_cf0,(char (*) [3])0x2d0653,&local_d38);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_cf0);
  local_d90 = (_Base_ptr)pVar2.first._M_node;
  local_d88 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_cf0);
  label_traits::~label_traits(&local_d38);
  UL::~UL(&local_d80);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e60,"Hearing Impaired",&local_e61);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_HI);
  UL::UL(&local_e88,pbVar1);
  label_traits::label_traits(&local_e40,&local_e60,true,&local_e88);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_df8,(char (*) [3])0x2d089d,&local_e40);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_df8);
  local_e98 = (_Base_ptr)pVar2.first._M_node;
  local_e90 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_df8);
  label_traits::~label_traits(&local_e40);
  UL::~UL(&local_e88);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator(&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f68,"Visually Impaired-Narrative",&local_f69);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_VIN);
  UL::UL(&local_f90,pbVar1);
  label_traits::label_traits(&local_f48,&local_f68,true,&local_f90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_f00,(char (*) [4])0x2d08b3,&local_f48);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_f00);
  local_fa0 = (_Base_ptr)pVar2.first._M_node;
  local_f98 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_f00);
  label_traits::~label_traits(&local_f48);
  UL::~UL(&local_f90);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"5.1",&local_1071);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioSoundfield_51);
  UL::UL(&local_1098,pbVar1);
  label_traits::label_traits(&local_1050,&local_1070,true,&local_1098);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_1008,(char (*) [3])0x2d068d,&local_1050);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1008);
  local_10a8 = (_Base_ptr)pVar2.first._M_node;
  local_10a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1008);
  label_traits::~label_traits(&local_1050);
  UL::~UL(&local_1098);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1178,"7.1DS",&local_1179);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioSoundfield_71);
  UL::UL(&local_11a0,pbVar1);
  label_traits::label_traits(&local_1158,&local_1178,true,&local_11a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_1110,(char (*) [3])0x2d06a2,&local_1158);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1110);
  local_11b0 = (_Base_ptr)pVar2.first._M_node;
  local_11a8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1110);
  label_traits::~label_traits(&local_1158);
  UL::~UL(&local_11a0);
  std::__cxx11::string::~string((string *)&local_1178);
  std::allocator<char>::~allocator(&local_1179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1280,"7.1SDS",&local_1281);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioSoundfield_SDS);
  UL::UL(&local_12a8,pbVar1);
  label_traits::label_traits(&local_1260,&local_1280,true,&local_12a8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_1218,(char (*) [4])0x2d46f1,&local_1260);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1218);
  local_12b8 = (_Base_ptr)pVar2.first._M_node;
  local_12b0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1218);
  label_traits::~label_traits(&local_1260);
  UL::~UL(&local_12a8);
  std::__cxx11::string::~string((string *)&local_1280);
  std::allocator<char>::~allocator(&local_1281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1388,"6.1",&local_1389);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioSoundfield_61);
  UL::UL(&local_13b0,pbVar1);
  label_traits::label_traits(&local_1368,&local_1388,true,&local_13b0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_1320,(char (*) [3])0x2d287b,&local_1368);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1320);
  local_13c0 = (_Base_ptr)pVar2.first._M_node;
  local_13b8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1320);
  label_traits::~label_traits(&local_1368);
  UL::~UL(&local_13b0);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator(&local_1389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1490,"1.0 Monaural",&local_1491);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioSoundfield_M);
  UL::UL(&local_14b8,pbVar1);
  label_traits::label_traits(&local_1470,&local_1490,true,&local_14b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_1428,(char (*) [2])0x2d28b7,&local_1470);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1428);
  local_14c8 = (_Base_ptr)pVar2.first._M_node;
  local_14c0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1428);
  label_traits::~label_traits(&local_1470);
  UL::~UL(&local_14b8);
  std::__cxx11::string::~string((string *)&local_1490);
  std::allocator<char>::~allocator(&local_1491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1598,"FSK Sync",&local_1599);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DCAudioChannel_FSKSyncSignalChannel);
  UL::UL(&local_15c0,pbVar1);
  label_traits::label_traits(&local_1578,&local_1598,true,&local_15c0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[8],_ASDCP::MXF::label_traits,_true>
            (&local_1530,(char (*) [8])"FSKSync",&local_1578);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1530);
  local_15d0 = (_Base_ptr)pVar2.first._M_node;
  local_15c8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1530);
  label_traits::~label_traits(&local_1578);
  UL::~UL(&local_15c0);
  std::__cxx11::string::~string((string *)&local_1598);
  std::allocator<char>::~allocator(&local_1599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16a0,"D-BOX Motion Code Primary Stream",&local_16a1);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DBOXMotionCodePrimaryStream);
  UL::UL(&local_16c8,pbVar1);
  label_traits::label_traits(&local_1680,&local_16a0,false,&local_16c8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_1638,(char (*) [5])"DBOX",&local_1680);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1638);
  local_16d8 = (_Base_ptr)pVar2.first._M_node;
  local_16d0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1638);
  label_traits::~label_traits(&local_1680);
  UL::~UL(&local_16c8);
  std::__cxx11::string::~string((string *)&local_16a0);
  std::allocator<char>::~allocator(&local_16a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17a8,"D-BOX Motion Code Secondary Stream",&local_17a9);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_DBOXMotionCodeSecondaryStream);
  UL::UL(&local_17d0,pbVar1);
  label_traits::label_traits(&local_1788,&local_17a8,false,&local_17d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[6],_ASDCP::MXF::label_traits,_true>
            (&local_1740,(char (*) [6])"DBOX2",&local_1788);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&this->m_LabelMap,&local_1740);
  local_17e0 = (_Base_ptr)pVar2.first._M_node;
  local_17d8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1740);
  label_traits::~label_traits(&local_1788);
  UL::~UL(&local_17d0);
  std::__cxx11::string::~string((string *)&local_17a8);
  std::allocator<char>::~allocator(&local_17a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_18b0,"Sign Language Video Stream",&local_18b1);
  pbVar1 = Dictionary::ul(this->m_Dict,MDD_AudioChannelSLVS);
  UL::UL(&local_18d8,pbVar1);
  label_traits::label_traits(&local_1890,&local_18b0,false,&local_18d8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_1848,(char (*) [5])0x2d24e7,&local_1890);
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
  ::insert(&this->m_LabelMap,&local_1848);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1848);
  label_traits::~label_traits(&local_1890);
  UL::~UL(&local_18d8);
  std::__cxx11::string::~string((string *)&local_18b0);
  std::allocator<char>::~allocator(&local_18b1);
  return;
}

Assistant:

ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(const Dictionary* d) : m_Dict(d), m_ChannelCount(0)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("L",     label_traits("Left"                              , true,  m_Dict->ul(MDD_DCAudioChannel_L))));
  m_LabelMap.insert(pair("R",     label_traits("Right"                             , true,  m_Dict->ul(MDD_DCAudioChannel_R))));
  m_LabelMap.insert(pair("C",     label_traits("Center"                            , true,  m_Dict->ul(MDD_DCAudioChannel_C))));
  m_LabelMap.insert(pair("LFE",   label_traits("LFE"                               , true,  m_Dict->ul(MDD_DCAudioChannel_LFE))));
  m_LabelMap.insert(pair("Ls",    label_traits("Left Surround"                     , true,  m_Dict->ul(MDD_DCAudioChannel_Ls))));
  m_LabelMap.insert(pair("Rs",    label_traits("Right Surround"                    , true,  m_Dict->ul(MDD_DCAudioChannel_Rs))));
  m_LabelMap.insert(pair("Lss",   label_traits("Left Side Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lss))));
  m_LabelMap.insert(pair("Rss",   label_traits("Right Side Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rss))));
  m_LabelMap.insert(pair("Lrs",   label_traits("Left Rear Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lrs))));
  m_LabelMap.insert(pair("Rrs",   label_traits("Right Rear Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rrs))));
  m_LabelMap.insert(pair("Lc",    label_traits("Left Center"                       , true,  m_Dict->ul(MDD_DCAudioChannel_Lc))));
  m_LabelMap.insert(pair("Rc",    label_traits("Right Center"                      , true,  m_Dict->ul(MDD_DCAudioChannel_Rc))));
  m_LabelMap.insert(pair("Cs",    label_traits("Center Surround"                   , true,  m_Dict->ul(MDD_DCAudioChannel_Cs))));
  m_LabelMap.insert(pair("HI",    label_traits("Hearing Impaired"                  , true,  m_Dict->ul(MDD_DCAudioChannel_HI))));
  m_LabelMap.insert(pair("VIN",   label_traits("Visually Impaired-Narrative"       , true,  m_Dict->ul(MDD_DCAudioChannel_VIN))));
  m_LabelMap.insert(pair("51",    label_traits("5.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_51))));
  m_LabelMap.insert(pair("71",    label_traits("7.1DS"                             , true,  m_Dict->ul(MDD_DCAudioSoundfield_71))));
  m_LabelMap.insert(pair("SDS",   label_traits("7.1SDS"                            , true,  m_Dict->ul(MDD_DCAudioSoundfield_SDS))));
  m_LabelMap.insert(pair("61",    label_traits("6.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_61))));
  m_LabelMap.insert(pair("M",     label_traits("1.0 Monaural"                      , true,  m_Dict->ul(MDD_DCAudioSoundfield_M))));
  m_LabelMap.insert(pair("FSKSync",   label_traits("FSK Sync"                      , true,  m_Dict->ul(MDD_DCAudioChannel_FSKSyncSignalChannel))));
  m_LabelMap.insert(pair("DBOX",  label_traits("D-BOX Motion Code Primary Stream"  , false, m_Dict->ul(MDD_DBOXMotionCodePrimaryStream))));
  m_LabelMap.insert(pair("DBOX2", label_traits("D-BOX Motion Code Secondary Stream", false, m_Dict->ul(MDD_DBOXMotionCodeSecondaryStream))));
  m_LabelMap.insert(pair("SLVS",  label_traits("Sign Language Video Stream"        , false, m_Dict->ul(MDD_AudioChannelSLVS))));
}